

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<int>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                   *this,int value)

{
  type pwVar1;
  wchar_t *pwVar2;
  wchar_t *local_30;
  wchar_t **local_28;
  type *it;
  int num_digits;
  int iStack_14;
  bool is_negative;
  main_type abs_value;
  int value_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  
  num_digits = value;
  iStack_14 = value;
  _abs_value = this;
  it._7_1_ = internal::is_negative<int>(value);
  if ((bool)it._7_1_) {
    num_digits = -num_digits;
  }
  it._0_4_ = internal::count_digits(num_digits);
  pwVar1 = reserve(this,(long)(int)(uint)((it._7_1_ & 1) != 0) + (long)(int)it);
  local_28 = &local_30;
  local_30 = pwVar1;
  if ((it._7_1_ & 1) != 0) {
    local_30 = pwVar1 + 1;
    *pwVar1 = L'-';
  }
  pwVar2 = internal::format_decimal<wchar_t,wchar_t*,unsigned_int>(local_30,num_digits,(int)it);
  *local_28 = pwVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }